

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int m_check_zero_block(aec_stream *strm)

{
  internal_state *piVar1;
  size_t i;
  uint32_t *p;
  internal_state *state;
  aec_stream *strm_local;
  
  piVar1 = strm->state;
  for (i = 0; (i < strm->block_size && (piVar1->block[i] == 0)); i = i + 1) {
  }
  if (i < strm->block_size) {
    if (piVar1->zero_blocks == 0) {
      piVar1->mode = m_select_code_option;
    }
    else {
      piVar1->block_nonzero = 1;
      piVar1->mode = m_encode_zero;
    }
  }
  else {
    piVar1->zero_blocks = piVar1->zero_blocks + 1;
    if (piVar1->zero_blocks == 1) {
      piVar1->zero_ref = piVar1->ref;
      piVar1->zero_ref_sample = piVar1->ref_sample;
    }
    if ((piVar1->blocks_avail == 0) || (piVar1->blocks_dispensed % 0x40 == 0)) {
      if (4 < piVar1->zero_blocks) {
        piVar1->zero_blocks = -1;
      }
      piVar1->mode = m_encode_zero;
    }
    else {
      piVar1->mode = m_get_block;
    }
  }
  return 1;
}

Assistant:

static int m_check_zero_block(struct aec_stream *strm)
{
    /**
       Check if input block is all zero.

       Aggregate consecutive zero blocks until we find !0 or reach the
       end of a segment or RSI.
    */

    struct internal_state *state = strm->state;
    uint32_t *p = state->block;

    size_t i;
    for (i = 0; i < strm->block_size; i++)
        if (p[i] != 0)
            break;

    if (i < strm->block_size) {
        if (state->zero_blocks) {
            /* The current block isn't zero but we have to emit a
             * previous zero block first. The current block will be
             * flagged and handled later.
             */
            state->block_nonzero = 1;
            state->mode = m_encode_zero;
            return M_CONTINUE;
        }
        state->mode = m_select_code_option;
        return M_CONTINUE;
    } else {
        state->zero_blocks++;
        if (state->zero_blocks == 1) {
            state->zero_ref = state->ref;
            state->zero_ref_sample = state->ref_sample;
        }
        if (state->blocks_avail == 0 || state->blocks_dispensed % 64 == 0) {
            if (state->zero_blocks > 4)
                state->zero_blocks = ROS;

            state->mode = m_encode_zero;
            return M_CONTINUE;
        }
        state->mode = m_get_block;
        return M_CONTINUE;
    }
}